

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O0

ShaderVariableVkImpl * __thiscall
Diligent::ShaderVariableManagerVk::GetVariable(ShaderVariableManagerVk *this,Char *Name)

{
  int iVar1;
  ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
  *this_00;
  PipelineResourceDesc *pPVar2;
  ShaderVariableVkImpl *Var;
  Uint32 v;
  Char *Name_local;
  ShaderVariableManagerVk *this_local;
  
  Var._4_4_ = 0;
  while( true ) {
    if (this->m_NumVariables <= Var._4_4_) {
      return (ShaderVariableVkImpl *)0x0;
    }
    this_00 = &(this->
               super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
               ).m_pVariables[Var._4_4_].
               super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
    ;
    pPVar2 = ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
             ::GetDesc(this_00);
    iVar1 = strcmp(pPVar2->Name,Name);
    if (iVar1 == 0) break;
    Var._4_4_ = Var._4_4_ + 1;
  }
  return (ShaderVariableVkImpl *)this_00;
}

Assistant:

ShaderVariableVkImpl* ShaderVariableManagerVk::GetVariable(const Char* Name) const
{
    for (Uint32 v = 0; v < m_NumVariables; ++v)
    {
        ShaderVariableVkImpl& Var = m_pVariables[v];
        if (strcmp(Var.GetDesc().Name, Name) == 0)
            return &Var;
    }
    return nullptr;
}